

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O2

void __thiscall
glcts::RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::deinit
          (RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
           *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->gl_oes_texture_multisample_2d_array_supported != '\0') {
    (**(code **)(lVar2 + 0xb8))(0x9102,0);
  }
  (**(code **)(lVar2 + 0x480))(1,&this->to_id);
  this->to_id = 0;
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Texture object deletion failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0x299);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (gl_oes_texture_multisample_2d_array_supported)
	{
		/* Bind default texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 0);
	}

	/* Delete texture object. */
	gl.deleteTextures(1, &to_id);

	to_id = 0;

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture object deletion failed.");

	/* Call base class' deinit() */
	TestCase::deinit();
}